

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O1

Aig_Man_t *
Dar_ManChoice(Aig_Man_t *pAig,int fBalance,int fUpdateLevel,int fConstruct,int nConfMax,
             int nLevelMax,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  Vec_Ptr_t *vAigs;
  void **ppvVar6;
  Aig_Man_t *pAVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  void **ppvVar11;
  timespec local_48;
  int local_38;
  int local_34;
  
  local_38 = nConfMax;
  local_34 = nLevelMax;
  iVar5 = clock_gettime(3,&local_48);
  if (iVar5 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  vAigs = Dar_ManChoiceSynthesis(pAig,fBalance,fUpdateLevel,0,fVerbose);
  iVar5 = (int)pAig;
  if (fConstruct != 0) goto LAB_004f37ca;
  iVar5 = vAigs->nSize;
  if (iVar5 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
  }
  ppvVar11 = vAigs->pArray;
  uVar1 = iVar5 - 1;
  vAigs->nSize = uVar1;
  if (iVar5 == 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar3 = ppvVar11[uVar1];
  pvVar4 = *ppvVar11;
  uVar2 = vAigs->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      ppvVar6 = (void **)realloc(ppvVar11,0x80);
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar2 * 2;
      if (iVar5 <= (int)uVar2) goto LAB_004f37a3;
      ppvVar6 = (void **)realloc(ppvVar11,(ulong)uVar2 << 4);
    }
    vAigs->pArray = ppvVar6;
    vAigs->nCap = iVar5;
  }
LAB_004f37a3:
  iVar5 = (int)ppvVar11;
  iVar10 = vAigs->nSize;
  vAigs->nSize = iVar10 + 1;
  vAigs->pArray[iVar10] = pvVar4;
  if ((long)iVar10 < 0) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
  }
  *vAigs->pArray = pvVar3;
LAB_004f37ca:
  if (fVerbose != 0) {
    Abc_Print(iVar5,"%s =","Synthesis time");
    iVar10 = 3;
    iVar5 = clock_gettime(3,&local_48);
    if (iVar5 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar9 + lVar8) / 1000000.0);
  }
  iVar5 = clock_gettime(3,&local_48);
  if (iVar5 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (fConstruct == 0) {
    pAVar7 = Aig_ManChoicePartitioned(vAigs,300,local_38,local_34,fVerbose);
  }
  else {
    pAVar7 = Aig_ManChoiceConstructive(vAigs,fVerbose);
  }
  if (0 < vAigs->nSize) {
    lVar9 = 0;
    do {
      Aig_ManStop((Aig_Man_t *)vAigs->pArray[lVar9]);
      lVar9 = lVar9 + 1;
    } while (lVar9 < vAigs->nSize);
  }
  ppvVar11 = vAigs->pArray;
  if (ppvVar11 != (void **)0x0) {
    free(ppvVar11);
    vAigs->pArray = (void **)0x0;
  }
  iVar5 = (int)ppvVar11;
  if (vAigs != (Vec_Ptr_t *)0x0) {
    free(vAigs);
    iVar5 = (int)vAigs;
  }
  if (fVerbose != 0) {
    Abc_Print(iVar5,"%s =","Choicing time ");
    iVar10 = 3;
    iVar5 = clock_gettime(3,&local_48);
    if (iVar5 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar9 + lVar8) / 1000000.0);
  }
  return pAVar7;
}

Assistant:

Aig_Man_t * Dar_ManChoice( Aig_Man_t * pAig, int fBalance, int fUpdateLevel, int fConstruct, int nConfMax, int nLevelMax, int fVerbose )
{
    Aig_Man_t * pMan, * pTemp;
    Vec_Ptr_t * vAigs;
    int i;
    abctime clk;

clk = Abc_Clock();
//    vAigs = Dar_ManChoiceSynthesisExt();
    vAigs = Dar_ManChoiceSynthesis( pAig, fBalance, fUpdateLevel, 0, fVerbose );

    // swap the first and last network
    // this should lead to the primary choice being "better" because of synthesis
    // (it is also important when constructing choices)
    if ( !fConstruct )
    {
        pMan = (Aig_Man_t *)Vec_PtrPop( vAigs );
        Vec_PtrPush( vAigs, Vec_PtrEntry(vAigs,0) );
        Vec_PtrWriteEntry( vAigs, 0, pMan );
    }

if ( fVerbose )
{
ABC_PRT( "Synthesis time", Abc_Clock() - clk );
}
clk = Abc_Clock();
    if ( fConstruct )
        pMan = Aig_ManChoiceConstructive( vAigs, fVerbose );
    else
        pMan = Aig_ManChoicePartitioned( vAigs, 300, nConfMax, nLevelMax, fVerbose );
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pTemp, i )
        Aig_ManStop( pTemp );
    Vec_PtrFree( vAigs );
if ( fVerbose )
{
ABC_PRT( "Choicing time ", Abc_Clock() - clk );
}
    return pMan;
//    return NULL;
}